

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

string * __thiscall
dap::
BasicTypeInfo<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::name(string *__return_storage_ptr__,
      BasicTypeInfo<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

inline std::string name() const override { return name_; }